

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O3

void gomory_hu_tree_create(GomoryHuTree *tree,int32_t nnodes)

{
  size_t __size;
  int32_t *piVar1;
  flow_t *pfVar2;
  GomoryHuTreeAdjRow *pGVar3;
  
  tree->nnodes = nnodes;
  __size = (long)nnodes * 4;
  piVar1 = (int32_t *)malloc(__size);
  (tree->field_3).sink_candidate = piVar1;
  pfVar2 = (flow_t *)malloc(__size);
  (tree->field_3).record_flows = pfVar2;
  pfVar2 = (flow_t *)malloc((ulong)(uint)(nnodes * nnodes) << 2);
  tree->maxflows = pfVar2;
  pGVar3 = (GomoryHuTreeAdjRow *)malloc((long)nnodes * __size * 8);
  (tree->field_3).rows = pGVar3;
  piVar1 = (int32_t *)malloc(__size);
  (tree->field_3).bfs_queue = piVar1;
  piVar1 = (int32_t *)malloc(__size);
  (tree->field_3).parent = piVar1;
  piVar1 = (int32_t *)malloc(__size);
  (tree->field_3).visited = piVar1;
  (tree->temp_result).nnodes = nnodes;
  piVar1 = (int32_t *)malloc(__size);
  (tree->temp_result).colors = piVar1;
  return;
}

Assistant:

void gomory_hu_tree_create(GomoryHuTree *tree, int32_t nnodes) {
    tree->nnodes = nnodes;
    tree->sink_candidate = malloc(nnodes * sizeof(*tree->sink_candidate));
    tree->record_flows = malloc(nnodes * sizeof(*tree->record_flows));
    tree->maxflows = malloc(nnodes * nnodes * sizeof(*tree->maxflows));
    tree->rows = malloc(nnodes * sizeof(tree->rows[0]) * nnodes *
                        sizeof(tree->rows[0].records[0]));

    tree->bfs_queue = malloc(nnodes * sizeof(*tree->bfs_queue));
    tree->parent = malloc(nnodes * sizeof(*tree->parent));
    tree->visited = malloc(nnodes * sizeof(*tree->visited));

    max_flow_result_create(&tree->temp_result, nnodes);
}